

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::EncodeChannelMask
                  (Error *__return_storage_ptr__,ByteArray *aBuf,ChannelMask *aChannelMask)

{
  bool bVar1;
  size_type sVar2;
  const_iterator __first;
  const_iterator __last;
  v10 *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view fmt;
  format_args args;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_178;
  const_iterator local_170;
  anon_class_1_0_00000001 local_152;
  v10 local_151;
  v10 *local_150;
  char *local_148;
  string local_140;
  Error local_120;
  reference local_f8;
  ChannelMaskEntry *entry;
  const_iterator __end2;
  const_iterator __begin2;
  ChannelMask *__range2;
  ChannelMask *aChannelMask_local;
  ByteArray *aBuf_local;
  Error *error;
  undefined1 local_a0 [16];
  v10 *local_90;
  char *local_88;
  undefined1 *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  Error **local_50;
  undefined1 *local_48;
  Error **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  Error **local_28;
  v10 **local_20;
  v10 *local_18;
  char *pcStack_10;
  
  Error::Error(__return_storage_ptr__);
  __end2 = std::
           vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           ::begin(aChannelMask);
  entry = (ChannelMaskEntry *)
          std::
          vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
          ::end(aChannelMask);
  while( true ) {
    this = (v10 *)&entry;
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_ot::commissioner::ChannelMaskEntry_*,_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_>
                                *)this);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    local_f8 = __gnu_cxx::
               __normal_iterator<const_ot::commissioner::ChannelMaskEntry_*,_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_>
               ::operator*(&__end2);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_f8->mMasks);
    if (0xfe < sVar2) break;
    utils::Encode<unsigned_char>(aBuf,local_f8->mPage);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_f8->mMasks);
    utils::Encode<unsigned_char>(aBuf,(uint8_t)sVar2);
    local_178._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(aBuf);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_170,&local_178);
    __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_f8->mMasks);
    __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&local_f8->mMasks);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,local_170,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current);
    __gnu_cxx::
    __normal_iterator<const_ot::commissioner::ChannelMaskEntry_*,_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_>
    ::operator++(&__end2);
  }
  EncodeChannelMask::anon_class_1_0_00000001::operator()(&local_152);
  local_58 = &local_150;
  local_60 = &local_151;
  bVar3 = ::fmt::v10::operator()(local_60);
  local_148 = (char *)bVar3.size_;
  local_150 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<const_unsigned_char_&,_FMT_COMPILE_STRING,_0>();
  local_68 = &local_140;
  local_78 = local_150;
  pcStack_70 = local_148;
  local_80 = &tlv::kEscapeLength;
  local_20 = &local_78;
  local_90 = local_150;
  local_88 = local_148;
  local_18 = local_90;
  pcStack_10 = local_88;
  error = (Error *)::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char_const>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
                               *)&tlv::kEscapeLength,this,(uchar *)local_68);
  local_48 = local_a0;
  local_50 = &error;
  local_38 = 2;
  fmt.size_ = 2;
  fmt.data_ = local_88;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_50;
  local_40 = local_50;
  local_30 = local_48;
  local_28 = local_50;
  ::fmt::v10::vformat_abi_cxx11_(&local_140,local_90,fmt,args);
  Error::Error(&local_120,kInvalidArgs,&local_140);
  Error::operator=(__return_storage_ptr__,&local_120);
  Error::~Error(&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeChannelMask(ByteArray &aBuf, const ChannelMask &aChannelMask)
{
    Error error;

    for (const auto &entry : aChannelMask)
    {
        VerifyOrExit(entry.mMasks.size() < tlv::kEscapeLength,
                     error = ERROR_INVALID_ARGS("Channel Mask list is tool long (>={})", tlv::kEscapeLength));

        utils::Encode(aBuf, entry.mPage);
        utils::Encode(aBuf, static_cast<uint8_t>(entry.mMasks.size()));
        aBuf.insert(aBuf.end(), entry.mMasks.begin(), entry.mMasks.end());
    }

exit:
    return error;
}